

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_tensor_layout.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateTensorTypeWithDimValuesNV
          (ValidationState_t *_,Instruction *inst,ExpectedNumValues expected,bool is_view)

{
  char *pcVar1;
  bool bVar2;
  spv_result_t sVar3;
  uint uVar4;
  uint id;
  uint32_t uVar5;
  Instruction *pIVar6;
  long lVar7;
  DiagnosticStream *pDVar8;
  undefined7 in_register_00000009;
  spv_result_t sVar9;
  int iVar10;
  size_t index;
  uint64_t dim_value;
  string type_str;
  char *local_258;
  string local_250;
  char *local_230;
  char *local_228;
  char *local_220;
  char local_218;
  undefined7 uStack_217;
  DiagnosticStream local_208;
  
  local_228 = &local_218;
  local_220 = (char *)0x0;
  local_218 = '\0';
  if ((int)CONCAT71(in_register_00000009,is_view) == 0) {
    sVar3 = ValidateTensorLayoutResultTypeNV(_,inst);
    if (sVar3 != SPV_SUCCESS) goto LAB_006a4621;
    pcVar1 = "createTensorLayout";
    sVar9 = sVar3;
  }
  else {
    sVar3 = ValidateTensorViewResultTypeNV(_,inst);
    if (sVar3 != SPV_SUCCESS) goto LAB_006a4621;
    pcVar1 = "createTensorView";
    sVar9 = sVar3;
  }
  std::__cxx11::string::_M_replace((ulong)&local_228,0,local_220,(ulong)(pcVar1 + 6));
  uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,0);
  id = Instruction::GetOperandAs<unsigned_int>(inst,2);
  pIVar6 = ValidationState_t::FindDef(_,id);
  if ((pIVar6 == (Instruction *)0x0) || (uVar4 != (pIVar6->inst_).type_id)) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    local_258 = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar8 = DiagnosticStream::operator<<(&local_208,&local_258);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar8," Result Type <id> ",0x12);
    ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar8,local_250._M_dataplus._M_p,local_250._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar8," does not match ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar8,local_228,(long)local_220);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar8," type.",6);
    sVar3 = pDVar8->error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  else {
    lVar7 = (long)(inst->operands_).
                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(inst->operands_).
                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
    pIVar6 = ValidationState_t::FindDef(_,uVar4);
    uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,1);
    bVar2 = ValidationState_t::EvalConstantValUint64(_,uVar4,(uint64_t *)&local_258);
    if (bVar2) {
      sVar3 = (*(code *)(&DAT_007cf604 + *(int *)(&DAT_007cf604 + (ulong)expected * 4)))();
      return sVar3;
    }
    sVar3 = SPV_SUCCESS;
    if (lVar7 != 3) {
      index = 3;
      sVar3 = sVar9;
      do {
        iVar10 = (int)index;
        uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,index);
        pIVar6 = ValidationState_t::FindDef(_,uVar4);
        if ((pIVar6 == (Instruction *)0x0) ||
           (bVar2 = ValidationState_t::IsIntScalarType(_,(pIVar6->inst_).type_id), !bVar2)) {
LAB_006a4554:
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          local_230 = spvOpcodeString((uint)(inst->inst_).opcode);
          pDVar8 = DiagnosticStream::operator<<(&local_208,&local_230);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar8," operand <id> ",0xe)
          ;
          ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar8,local_250._M_dataplus._M_p,local_250._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar8," is not a 32-bit integer.",0x19);
          sVar3 = pDVar8->error_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream(&local_208);
          bVar2 = false;
        }
        else {
          uVar5 = ValidationState_t::GetBitWidth(_,(pIVar6->inst_).type_id);
          bVar2 = true;
          if (uVar5 != 0x20) goto LAB_006a4554;
        }
        if (!bVar2) goto LAB_006a4621;
        index = (size_t)(iVar10 + 1);
      } while ((ulong)(iVar10 - 2) < lVar7 - 3U);
      sVar3 = SPV_SUCCESS;
    }
  }
LAB_006a4621:
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
  }
  return sVar3;
}

Assistant:

spv_result_t ValidateTensorTypeWithDimValuesNV(ValidationState_t& _,
                                               const Instruction* inst,
                                               ExpectedNumValues expected,
                                               bool is_view) {
  std::string type_str;
  if (is_view) {
    if (auto error = ValidateTensorViewResultTypeNV(_, inst)) return error;
    type_str = "TensorView";
  } else {
    if (auto error = ValidateTensorLayoutResultTypeNV(_, inst)) return error;
    type_str = "TensorLayout";
  }

  const auto result_type_id = inst->GetOperandAs<uint32_t>(0);
  const auto tensor_id = inst->GetOperandAs<uint32_t>(2);
  const auto tensor = _.FindDef(tensor_id);
  if (!tensor || result_type_id != tensor->type_id()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " Result Type <id> "
           << _.getIdName(result_type_id) << " does not match " << type_str
           << " type.";
  }

  const auto num_values = inst->operands().size() - 3;

  const auto result_type = _.FindDef(result_type_id);
  const auto dim_index = 1;
  const auto dim_id = result_type->GetOperandAs<uint32_t>(dim_index);
  uint64_t dim_value;
  if (_.EvalConstantValUint64(dim_id, &dim_value)) {
    uint64_t expected_num_values = 0;
    switch (expected) {
      case DIM:
        expected_num_values = dim_value;
        break;
      case DIMx2:
        expected_num_values = dim_value * 2;
        break;
      case ONE:
        expected_num_values = 1;
        break;
      case FOUR:
        expected_num_values = 4;
        break;
    }

    if (num_values != expected_num_values) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode())
             << " unexpected number of operands.";
    }
  }

  for (uint32_t i = 0; i < num_values; ++i) {
    const auto val_id = inst->GetOperandAs<uint32_t>(i + 3);
    const auto val = _.FindDef(val_id);
    if (!val || !_.IsIntScalarType(val->type_id()) ||
        _.GetBitWidth(val->type_id()) != 32) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode()) << " operand <id> "
             << _.getIdName(val_id) << " is not a 32-bit integer.";
    }
  }

  return SPV_SUCCESS;
}